

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

void mtbdd_gc_mark_external_refs_CALL(WorkerP *w,Task *__dq_head)

{
  Worker *pWVar1;
  Task *pTVar2;
  uint64_t uVar3;
  uint uVar4;
  Task *__dq_head_00;
  long lVar5;
  long lVar6;
  uint64_t *it;
  uint64_t *local_38;
  
  local_38 = refs_iter(&mtbdd_refs,0,mtbdd_refs.refs_size);
  if (local_38 != (uint64_t *)0x0) {
    lVar5 = (long)__dq_head << 0x1a;
    lVar6 = 0;
    pTVar2 = __dq_head;
    do {
      __dq_head_00 = pTVar2;
      uVar3 = refs_next(&mtbdd_refs,&local_38,mtbdd_refs.refs_size);
      if (__dq_head_00 == w->end) {
        lace_abort_stack_overflow();
      }
      __dq_head_00->f = mtbdd_gc_mark_rec_WRAP;
      (__dq_head_00->thief)._M_b._M_p = (__pointer_type)0x1;
      *(uint64_t *)__dq_head_00->d = uVar3;
      pWVar1 = w->_public;
      if (w->allstolen == '\0') {
        if (pWVar1->movesplit != '\0') {
          uVar4 = (uint)((int)((ulong)((long)__dq_head - (long)w->dq) >> 6) + 2 +
                        (int)((ulong)((long)w->split - (long)w->dq) >> 6)) >> 1;
          LOCK();
          *(uint *)((long)&pWVar1->ts + 4) = uVar4;
          UNLOCK();
          w->split = w->dq + uVar4;
          pWVar1->movesplit = '\0';
        }
      }
      else {
        if (pWVar1->movesplit != '\0') {
          pWVar1->movesplit = '\0';
        }
        LOCK();
        pWVar1->ts = (TailSplit)
                     ((lVar5 + (long)w->dq * -0x4000000 & 0xffffffff00000000U) + 0x100000000 |
                     (ulong)((long)__dq_head - (long)w->dq) >> 6 & 0xffffffff);
        UNLOCK();
        pWVar1->allstolen = '\0';
        w->split = __dq_head_00 + 1;
        w->allstolen = '\0';
      }
      lVar6 = lVar6 + -1;
      __dq_head = __dq_head + 1;
      lVar5 = lVar5 + 0x100000000;
      pTVar2 = __dq_head_00 + 1;
    } while (local_38 != (uint64_t *)0x0);
    local_38 = (uint64_t *)0x0;
    for (; lVar6 != 0; lVar6 = lVar6 + 1) {
      if ((w->_public->movesplit == '\0') && (w->split <= __dq_head_00)) {
        (__dq_head_00->thief)._M_b._M_p = (__pointer_type)0x0;
        mtbdd_gc_mark_rec_CALL(w,__dq_head_00,*(MDD *)__dq_head_00->d);
      }
      else {
        mtbdd_gc_mark_rec_SYNC_SLOW(w,__dq_head_00);
      }
      __dq_head_00 = __dq_head_00 + -1;
    }
  }
  return;
}

Assistant:

VOID_TASK_0(mtbdd_gc_mark_external_refs)
{
    // iterate through refs hash table, mark all found
    size_t count=0;
    uint64_t *it = refs_iter(&mtbdd_refs, 0, mtbdd_refs.refs_size);
    while (it != NULL) {
        SPAWN(mtbdd_gc_mark_rec, refs_next(&mtbdd_refs, &it, mtbdd_refs.refs_size));
        count++;
    }
    while (count--) {
        SYNC(mtbdd_gc_mark_rec);
    }
}